

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::doAddCol
          (SPxLPBase<double> *this,double *objValue,double *lowerValue,SVectorBase<double> *colVec,
          double *upperValue,bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  SVectorBase<double> *this_00;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  long *in_RDI;
  byte in_R9B;
  Real RVar7;
  int k;
  LPRowBase<double> empty;
  double val;
  int i;
  int j;
  SVectorBase<double> *vec;
  DataArray<int> *rowscaleExp;
  int newColScaleExp;
  int oldRowNumber;
  int idx;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  LPRowBase<double> *in_stack_ffffffffffffff08;
  LPRowSetBase<double> *in_stack_ffffffffffffff10;
  SVectorBase<double> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  double *in_stack_ffffffffffffff28;
  LPColSetBase<double> *in_stack_ffffffffffffff30;
  double dVar8;
  int local_9c;
  uint local_54;
  int local_38;
  
  iVar1 = nCols((SPxLPBase<double> *)0x235ecd);
  iVar2 = nRows((SPxLPBase<double> *)0x235ede);
  local_38 = 0;
  LPColSetBase<double>::add
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (double *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,(double *)in_stack_ffffffffffffff10,
             (int *)in_stack_ffffffffffffff08);
  if ((int)in_RDI[0x32] != 1) {
    pdVar4 = LPColSetBase<double>::maxObj_w
                       ((LPColSetBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
    *pdVar4 = *pdVar4 * -1.0;
  }
  if ((in_R9B & 1) != 0) {
    local_38 = (**(code **)(*(long *)in_RDI[0x35] + 8))
                         ((long *)in_RDI[0x35],in_RCX,(DataArray<int> *)(in_RDI + 0x16));
    pdVar4 = upper((SPxLPBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc);
    dVar8 = *pdVar4;
    pdVar4 = (double *)infinity();
    if (dVar8 < *pdVar4) {
      upper_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              in_stack_fffffffffffffefc);
      RVar7 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
      pdVar4 = upper_w((SPxLPBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
      *pdVar4 = RVar7;
    }
    pdVar4 = lower((SPxLPBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc);
    dVar8 = *pdVar4;
    pdVar4 = (double *)infinity();
    if (-*pdVar4 < dVar8) {
      lower_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              in_stack_fffffffffffffefc);
      RVar7 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
      pdVar4 = lower_w((SPxLPBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
      *pdVar4 = RVar7;
    }
    maxObj_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc);
    RVar7 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
    pdVar4 = maxObj_w((SPxLPBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffefc);
    *pdVar4 = RVar7;
    iVar3 = local_38;
    piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),iVar1);
    *piVar5 = iVar3;
  }
  this_00 = colVector_w((SPxLPBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
  local_54 = SVectorBase<double>::size(this_00);
  uVar6 = extraout_RDX;
  while (local_54 = local_54 - 1, -1 < (int)local_54) {
    piVar5 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)local_54,(int)uVar6);
    iVar1 = *piVar5;
    if ((in_R9B & 1) != 0) {
      pdVar4 = SVectorBase<double>::value(this_00,local_54);
      in_stack_ffffffffffffff08 = (LPRowBase<double> *)*pdVar4;
      in_stack_ffffffffffffff04 = local_38;
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),iVar1);
      in_stack_ffffffffffffff10 =
           (LPRowSetBase<double> *)
           spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    in_stack_fffffffffffffefc);
      pdVar4 = SVectorBase<double>::value(this_00,local_54);
      *pdVar4 = (double)in_stack_ffffffffffffff10;
    }
    SVectorBase<double>::value(this_00,local_54);
    in_stack_ffffffffffffff00 = iVar1;
    iVar3 = nRows((SPxLPBase<double> *)0x236232);
    if (iVar3 <= in_stack_ffffffffffffff00) {
      LPRowBase<double>::LPRowBase
                ((LPRowBase<double> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
      in_stack_fffffffffffffefc = nRows((SPxLPBase<double> *)0x236252);
      for (local_9c = in_stack_fffffffffffffefc; local_9c <= iVar1; local_9c = local_9c + 1) {
        LPRowSetBase<double>::add(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x2362b4);
    }
    LPRowSetBase<double>::add2
              (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               (int)in_stack_ffffffffffffff08,
               (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    uVar6 = extraout_RDX_00;
  }
  (**(code **)(*in_RDI + 0x288))(in_RDI,1);
  iVar1 = nRows((SPxLPBase<double> *)0x23630d);
  (**(code **)(*in_RDI + 0x280))(in_RDI,iVar1 - iVar2);
  return;
}

Assistant:

void doAddCol(const R& objValue, const R& lowerValue, const SVectorBase<R>& colVec,
                 const R& upperValue, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(objValue, lowerValue, colVec, upperValue);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(colVec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      SVectorBase<R>& vec = colVector_w(idx);

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }